

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

void __thiscall FIX::Session::nextLogon(Session *this,Message *logon,UtcTimeStamp *now)

{
  UtcTimeStamp *this_00;
  bool bVar1;
  uint uVar2;
  FieldMap *pFVar3;
  ostream *poVar4;
  FieldBase *field;
  IntTConvertor<unsigned_long> *this_01;
  uint64_t uVar5;
  SEQNUM SVar6;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  unsigned_long value_02;
  uchar *in_R8;
  size_t in_R9;
  UInt64Field local_618;
  IntTConvertor<unsigned_long> *local_5c0;
  SEQNUM next;
  string local_560;
  string local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e0;
  IntTConvertor<unsigned_long> *local_4c0;
  SEQNUM endSeqNo;
  uint64_t beginSeqNo;
  Locker l;
  string local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  UInt64Field *local_408;
  MsgSeqNum *msgSeqNum;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  string local_388;
  string local_368;
  stringstream local_348 [8];
  stringstream stream;
  ostream local_338 [376];
  undefined1 local_1c0 [8];
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  undefined1 local_160 [7];
  bool sendRetransmitsAfterLogon;
  undefined4 local_148;
  allocator<char> local_141;
  string local_140;
  UtcTimeStamp local_120;
  allocator<char> local_101;
  string local_100;
  BOOLEAN local_d9;
  undefined1 local_d8 [8];
  ResetSeqNumFlag resetSeqNumFlag;
  string local_78;
  allocator<char> local_41;
  string local_40;
  UtcTimeStamp *local_20;
  UtcTimeStamp *now_local;
  Message *logon_local;
  Session *this_local;
  
  local_20 = now;
  now_local = (UtcTimeStamp *)logon;
  logon_local = (Message *)this;
  pFVar3 = &Message::getHeader(logon)->super_FieldMap;
  FieldMap::getField<FIX::SenderCompID>(pFVar3);
  pFVar3 = &Message::getHeader((Message *)now_local)->super_FieldMap;
  FieldMap::getField<FIX::TargetCompID>(pFVar3);
  if ((this->m_refreshOnLogon & 1U) != 0) {
    refresh(this);
  }
  bVar1 = isEnabled(this);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Session is not enabled for logon",&local_41);
    SessionState::onEvent(&this->m_state,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    disconnect(this);
    return;
  }
  bVar1 = isLogonTime(this,local_20);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Received logon outside of valid logon time",
               (allocator<char> *)
               ((long)&resetSeqNumFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum + 3));
    SessionState::onEvent(&this->m_state,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&resetSeqNumFlag.super_BoolField.super_FieldBase.m_metrics.m_checksum + 3));
    disconnect(this);
    return;
  }
  local_d9 = false;
  ResetSeqNumFlag::ResetSeqNumFlag((ResetSeqNumFlag *)local_d8,&local_d9);
  FieldMap::getFieldIfSet((FieldMap *)now_local,(FieldBase *)local_d8);
  bVar1 = BoolField::operator_cast_to_bool((BoolField *)local_d8);
  SessionState::receivedReset(&this->m_state,bVar1);
  bVar1 = SessionState::receivedReset(&this->m_state);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,
               "Logon contains ResetSeqNumFlag=Y, reseting sequence numbers to 1",&local_101);
    SessionState::onEvent(&this->m_state,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    bVar1 = SessionState::sentReset(&this->m_state);
    if (!bVar1) {
      std::function<FIX::UtcTimeStamp_()>::operator()(&local_120,&this->m_timestamper);
      SessionState::reset(&this->m_state,&local_120);
      UtcTimeStamp::~UtcTimeStamp(&local_120);
    }
  }
  bVar1 = SessionState::shouldSendLogon(&this->m_state);
  if ((bVar1) && (bVar1 = SessionState::receivedReset(&this->m_state), !bVar1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,"Received logon response before sending request",&local_141);
    SessionState::onEvent(&this->m_state,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    disconnect(this);
    local_148 = 1;
    goto LAB_0029eb50;
  }
  bVar1 = SessionState::initiate(&this->m_state);
  if ((!bVar1) && ((this->m_resetOnLogon & 1U) != 0)) {
    std::function<FIX::UtcTimeStamp_()>::operator()((UtcTimeStamp *)local_160,&this->m_timestamper);
    SessionState::reset(&this->m_state,(UtcTimeStamp *)local_160);
    UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_160);
  }
  uVar2 = verify(this,(EVP_PKEY_CTX *)now_local,(uchar *)0x0,1,in_R8,in_R9);
  if ((uVar2 & 1) == 0) {
    local_148 = 1;
    goto LAB_0029eb50;
  }
  SessionState::receivedLogon(&this->m_state,true);
  nextExpectedMsgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum._3_1_ = 0;
  NextExpectedMsgSeqNum::NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)local_1c0);
  bVar1 = FieldMap::getFieldIfSet((FieldMap *)now_local,(FieldBase *)local_1c0);
  if (bVar1) {
    uVar5 = UInt64Field::getValue((UInt64Field *)local_1c0);
    SVar6 = getExpectedSenderNum(this);
    if (uVar5 < SVar6) {
      nextExpectedMsgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum._3_1_ = 1;
      goto LAB_0029e1ad;
    }
    uVar5 = UInt64Field::getValue((UInt64Field *)local_1c0);
    SVar6 = getExpectedSenderNum(this);
    if (uVar5 <= SVar6) goto LAB_0029e1ad;
    std::__cxx11::stringstream::stringstream(local_348);
    poVar4 = std::operator<<(local_338,"NextExpectedMsgSeqNum too high, expecting ");
    SVar6 = getExpectedSenderNum(this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,SVar6);
    poVar4 = std::operator<<(poVar4," but received ");
    operator<<(poVar4,(FieldBase *)local_1c0);
    std::__cxx11::stringstream::str();
    SessionState::onEvent(&this->m_state,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    std::__cxx11::stringstream::str();
    generateLogout(this,&local_388);
    std::__cxx11::string::~string((string *)&local_388);
    disconnect(this);
    local_148 = 1;
    std::__cxx11::stringstream::~stringstream(local_348);
  }
  else {
LAB_0029e1ad:
    bVar1 = SessionState::initiate(&this->m_state);
    if ((!bVar1) ||
       ((bVar1 = SessionState::receivedReset(&this->m_state), bVar1 &&
        (bVar1 = SessionState::sentReset(&this->m_state), !bVar1)))) {
      this_00 = now_local;
      field = (FieldBase *)SessionState::heartBtInt(&this->m_state);
      FieldMap::getFieldIfSet((FieldMap *)this_00,field);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3a8,"Received logon request",&local_3a9);
      SessionState::onEvent(&this->m_state,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator(&local_3a9);
      generateLogon(this,(Message *)now_local);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3d0,"Responding to logon request",&local_3d1);
      SessionState::onEvent(&this->m_state,&local_3d0);
      std::__cxx11::string::~string((string *)&local_3d0);
      std::allocator<char>::~allocator(&local_3d1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f8,"Received logon response",
                 (allocator<char> *)((long)&msgSeqNum + 7));
      SessionState::onEvent(&this->m_state,&local_3f8);
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&msgSeqNum + 7));
    }
    SessionState::sentReset(&this->m_state,false);
    SessionState::receivedReset(&this->m_state,false);
    pFVar3 = &Message::getHeader((Message *)now_local)->super_FieldMap;
    local_408 = &FieldMap::getField<FIX::MsgSeqNum>(pFVar3)->super_SeqNumField;
    bVar1 = isTargetTooHigh(this,(MsgSeqNum *)local_408);
    if ((!bVar1) || (bVar1 = BoolField::operator_cast_to_bool((BoolField *)local_d8), bVar1)) {
      SessionState::incrNextTargetMsgSeqNum(&this->m_state);
      nextQueued(this,local_20);
    }
    else if ((this->m_sendNextExpectedMsgSeqNum & 1U) == 0) {
      doTargetTooHigh(this,(Message *)now_local);
    }
    else {
      this_01 = (IntTConvertor<unsigned_long> *)getExpectedTargetNum(this);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_488,this_01,value);
      std::operator+(&local_468,"Expecting retransmits FROM: ",&local_488);
      std::operator+(&local_448,&local_468," TO: ");
      uVar5 = UInt64Field::operator_cast_to_unsigned_long(local_408);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                ((string *)&l,(IntTConvertor<unsigned_long> *)(uVar5 - 1),value_00);
      std::operator+(&local_428,&local_448,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&l);
      SessionState::onEvent(&this->m_state,&local_428);
      std::__cxx11::string::~string((string *)&local_428);
      std::__cxx11::string::~string((string *)&l);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::~string((string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      uVar5 = UInt64Field::operator_cast_to_unsigned_long(local_408);
      SessionState::queue(&this->m_state,uVar5,(Message *)now_local);
      SVar6 = getExpectedTargetNum(this);
      uVar5 = UInt64Field::operator_cast_to_unsigned_long(local_408);
      SessionState::resendRange(&this->m_state,SVar6,uVar5 - 1);
    }
    bVar1 = isLoggedOn(this);
    if (bVar1) {
      (**(code **)(*(long *)this->m_application + 0x18))(this->m_application,&this->m_sessionID);
    }
    if ((nextExpectedMsgSeqNum.super_SeqNumField.super_FieldBase.m_metrics.m_checksum._3_1_ & 1) !=
        0) {
      Locker::Locker((Locker *)&beginSeqNo,&this->m_mutex);
      endSeqNo = UInt64Field::getValue((UInt64Field *)local_1c0);
      SVar6 = getExpectedSenderNum(this);
      local_4c0 = (IntTConvertor<unsigned_long> *)(SVar6 - 1);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_540,(IntTConvertor<unsigned_long> *)endSeqNo,value_01);
      std::operator+(&local_520,
                     "Sending retransmits due to received NextExpectedMsgSeqNum is too low. FROM: ",
                     &local_540);
      std::operator+(&local_500,&local_520," TO: ");
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_560,local_4c0,value_02);
      std::operator+(&local_4e0,&local_500,&local_560);
      SessionState::onEvent(&this->m_state,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_540);
      if ((this->m_persistMessages & 1U) == 0) {
        EndSeqNo::EndSeqNo((EndSeqNo *)&next,(SEQNUM)(local_4c0 + 1));
        local_4c0 = (IntTConvertor<unsigned_long> *)
                    UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)&next);
        EndSeqNo::~EndSeqNo((EndSeqNo *)&next);
        local_5c0 = (IntTConvertor<unsigned_long> *)
                    SessionState::getNextSenderMsgSeqNum(&this->m_state);
        if (local_5c0 < local_4c0) {
          EndSeqNo::EndSeqNo((EndSeqNo *)&local_618,(SEQNUM)local_5c0);
          local_4c0 = (IntTConvertor<unsigned_long> *)
                      UInt64Field::operator_cast_to_unsigned_long(&local_618);
          EndSeqNo::~EndSeqNo((EndSeqNo *)&local_618);
        }
        generateSequenceReset(this,endSeqNo,(SEQNUM)local_4c0);
      }
      else {
        generateRetransmits(this,endSeqNo,(SEQNUM)local_4c0);
      }
      Locker::~Locker((Locker *)&beginSeqNo);
    }
    local_148 = 0;
  }
  NextExpectedMsgSeqNum::~NextExpectedMsgSeqNum((NextExpectedMsgSeqNum *)local_1c0);
LAB_0029eb50:
  ResetSeqNumFlag::~ResetSeqNumFlag((ResetSeqNumFlag *)local_d8);
  return;
}

Assistant:

void Session::nextLogon(const Message &logon, const UtcTimeStamp &now) {
  logon.getHeader().getField<SenderCompID>();
  logon.getHeader().getField<TargetCompID>();

  if (m_refreshOnLogon) {
    refresh();
  }

  if (!isEnabled()) {
    m_state.onEvent("Session is not enabled for logon");
    disconnect();
    return;
  }

  if (!isLogonTime(now)) {
    m_state.onEvent("Received logon outside of valid logon time");
    disconnect();
    return;
  }

  ResetSeqNumFlag resetSeqNumFlag(false);
  logon.getFieldIfSet(resetSeqNumFlag);
  m_state.receivedReset(resetSeqNumFlag);

  if (m_state.receivedReset()) {
    m_state.onEvent("Logon contains ResetSeqNumFlag=Y, reseting sequence numbers to 1");
    if (!m_state.sentReset()) {
      m_state.reset(m_timestamper());
    }
  }

  if (m_state.shouldSendLogon() && !m_state.receivedReset()) {
    m_state.onEvent("Received logon response before sending request");
    disconnect();
    return;
  }

  if (!m_state.initiate() && m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }

  if (!verify(logon, false, true)) {
    return;
  }
  m_state.receivedLogon(true);

  bool sendRetransmitsAfterLogon = false;
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  if (logon.getFieldIfSet(nextExpectedMsgSeqNum)) {
    if (nextExpectedMsgSeqNum.getValue() < getExpectedSenderNum()) {
      sendRetransmitsAfterLogon = true;
    } else if (nextExpectedMsgSeqNum.getValue() > getExpectedSenderNum()) {
      std::stringstream stream;
      stream << "NextExpectedMsgSeqNum too high, expecting " << getExpectedSenderNum() << " but received "
             << nextExpectedMsgSeqNum;
      m_state.onEvent(stream.str());
      generateLogout(stream.str());
      disconnect();
      return;
    }
  }

  if (!m_state.initiate() || (m_state.receivedReset() && !m_state.sentReset())) {
    logon.getFieldIfSet(m_state.heartBtInt());
    m_state.onEvent("Received logon request");
    generateLogon(logon);
    m_state.onEvent("Responding to logon request");
  } else {
    m_state.onEvent("Received logon response");
  }

  m_state.sentReset(false);
  m_state.receivedReset(false);

  auto const &msgSeqNum = logon.getHeader().getField<MsgSeqNum>();
  if (isTargetTooHigh(msgSeqNum) && !resetSeqNumFlag) {
    if (m_sendNextExpectedMsgSeqNum) {
      m_state.onEvent(
          "Expecting retransmits FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
          + " TO: " + SEQNUM_CONVERTOR::convert(msgSeqNum - 1));
      m_state.queue(msgSeqNum, logon);
      m_state.resendRange(getExpectedTargetNum(), msgSeqNum - 1);
    } else {
      doTargetTooHigh(logon);
    }
  } else {
    m_state.incrNextTargetMsgSeqNum();
    nextQueued(now);
  }

  if (isLoggedOn()) {
    m_application.onLogon(m_sessionID);
  }

  if (sendRetransmitsAfterLogon) {
    Locker l(m_mutex);

    auto beginSeqNo = nextExpectedMsgSeqNum.getValue();
    auto endSeqNo = getExpectedSenderNum() - 1;
    m_state.onEvent(
        "Sending retransmits due to received NextExpectedMsgSeqNum is too low. FROM: "
        + SEQNUM_CONVERTOR::convert(beginSeqNo) + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

    if (!m_persistMessages) {
      endSeqNo = EndSeqNo(endSeqNo + 1);
      auto next = m_state.getNextSenderMsgSeqNum();
      if (endSeqNo > next) {
        endSeqNo = EndSeqNo(next);
      }
      generateSequenceReset(beginSeqNo, endSeqNo);
    } else {
      generateRetransmits(beginSeqNo, endSeqNo);
    }
  }
}